

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O3

void libxml_domnode_tim_sort(xmlNodePtr *dst,size_t size)

{
  ulong uVar1;
  xmlNodePtr *ppxVar2;
  size_t sVar3;
  xmlNodePtr *ppxVar4;
  xmlNodePtr *ppxVar5;
  xmlNodePtr *ppxVar6;
  bool bVar7;
  long lVar8;
  TEMP_STORAGE_T *pTVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  size_t stack_curr;
  size_t curr;
  TEMP_STORAGE_T _store;
  TIM_SORT_RUN_T run_stack [128];
  size_t local_870 [3];
  TEMP_STORAGE_T local_858;
  TEMP_STORAGE_T *pTStack_840;
  TIM_SORT_RUN_T local_838;
  ulong local_820;
  
  local_870[0] = 0;
  local_870[1] = 0;
  if (1 < size) {
    if (size < 0x40) {
      libxml_domnode_binary_insertion_sort_start(dst,1,size);
      return;
    }
    lVar8 = 0x3f;
    if (size != 0) {
      for (; size >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    bVar13 = 0x3a - ((byte)lVar8 ^ 0x3f);
    local_870[2] = (size_t)(int)(((int)(size >> (bVar13 & 0x3f)) + 1) -
                                (uint)((~(-1L << (bVar13 & 0x3f)) & size) == 0));
    local_858.alloc = 0;
    local_858.storage = (xmlNodePtr *)0x0;
    iVar10 = PUSH_NEXT(dst,size,&local_858,local_870[2],&local_838,local_870,local_870 + 1);
    if ((iVar10 != 0) &&
       (iVar10 = PUSH_NEXT(dst,size,&local_858,local_870[2],&local_838,local_870,local_870 + 1),
       iVar10 != 0)) {
LAB_001b86f0:
      iVar10 = PUSH_NEXT(dst,size,&local_858,local_870[2],&local_838,local_870,local_870 + 1);
      if (iVar10 != 0) {
        while( true ) {
          uVar11 = (uint)local_870[0];
          if ((int)uVar11 < 2) break;
          if (uVar11 == 2) {
            if (local_820 < local_838.length) break;
          }
          else {
            uVar15 = (ulong)(uVar11 & 0x7fffffff);
            if (((&pTStack_840)[uVar15 * 2] < (TEMP_STORAGE_T *)(&local_858)[uVar15].storage) &&
               ((ulong)((long)&((TEMP_STORAGE_T *)(&local_858)[uVar15].storage)->alloc +
                       (long)&(&pTStack_840)[uVar15 * 2]->alloc) < local_870[uVar15 * 2 + 2]))
            break;
            uVar15 = (long)(int)uVar11;
            do {
              uVar12 = uVar15 & 0xffffffff;
              ppxVar4 = (xmlNodePtr *)local_870[uVar12 * 2 + 2];
              ppxVar5 = (&local_858)[uVar12].storage;
              if ((uint)uVar15 < 4) {
                bVar7 = false;
              }
              else {
                bVar7 = local_870[uVar12 * 2] <= (ulong)((long)ppxVar4 + (long)ppxVar5);
              }
              uVar1 = uVar15 - 1;
              uVar14 = uVar1 & 0xffffffff;
              ppxVar6 = (xmlNodePtr *)(&local_838)[uVar14].length;
              ppxVar2 = (xmlNodePtr *)((long)ppxVar6 + (long)ppxVar5);
              if ((!(bool)(ppxVar4 <= ppxVar2 | bVar7)) && (ppxVar6 < ppxVar5)) goto LAB_001b885e;
              if ((ppxVar4 <= ppxVar2 || bVar7) && (ppxVar6 < ppxVar5)) {
                pTStack_840 = &local_858 + uVar12;
                libxml_domnode_tim_sort_merge(dst,&local_838,(int)uVar1,&local_858);
                local_870[uVar12 * 2 + 2] = (long)ppxVar5 + (long)ppxVar4;
                pTVar9 = pTStack_840;
                ppxVar4 = (xmlNodePtr *)(&local_838)[uVar14].length;
                pTStack_840->alloc = (&local_838)[uVar14].start;
                pTVar9->storage = ppxVar4;
              }
              else {
                libxml_domnode_tim_sort_merge(dst,&local_838,(uint)uVar15,&local_858);
                (&local_858)[uVar12].storage = ppxVar2;
              }
              uVar15 = uVar1;
            } while ((int)uVar1 != 2);
          }
          sVar3 = local_820 + local_838.length;
          uVar15 = 2;
          if (local_838.length <= local_820 || sVar3 == size) {
            libxml_domnode_tim_sort_merge(dst,&local_838,2,&local_858);
            local_838.length = sVar3;
            uVar15 = 1;
          }
LAB_001b885e:
          local_870[0] = uVar15;
        }
        goto LAB_001b86f0;
      }
    }
  }
  return;
}

Assistant:

void TIM_SORT(SORT_TYPE *dst, const size_t size) {
  size_t minrun;
  TEMP_STORAGE_T _store, *store;
  TIM_SORT_RUN_T run_stack[TIM_SORT_STACK_SIZE];
  size_t stack_curr = 0;
  size_t curr = 0;

  /* don't bother sorting an array of size 1 */
  if (size <= 1) {
    return;
  }

  if (size < 64) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  /* compute the minimum run length */
  minrun = compute_minrun(size);
  /* temporary storage for merges */
  store = &_store;
  store->alloc = 0;
  store->storage = NULL;

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  while (1) {
    if (!CHECK_INVARIANT(run_stack, stack_curr)) {
      stack_curr = TIM_SORT_COLLAPSE(dst, run_stack, stack_curr, store, size);
      continue;
    }

    if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
      return;
    }
  }
}